

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_test.cc
# Opt level: O2

void __thiscall anon_unknown.dwarf_cb061::StateBasic::Run(StateBasic *this)

{
  Test *pTVar1;
  bool condition;
  Rule *this_00;
  Edge *edge;
  Node *pNVar2;
  StringPiece text;
  StringPiece text_00;
  StringPiece text_01;
  StringPiece text_02;
  StringPiece path;
  StringPiece path_00;
  StringPiece path_01;
  StringPiece path_02;
  StringPiece path_03;
  StringPiece path_04;
  allocator<char> local_159;
  string local_158;
  EvalString command;
  State state;
  
  State::State(&state);
  command.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  command.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  command.parsed_.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  text.len_ = 4;
  text.str_ = "cat ";
  EvalString::AddText(&command,text);
  text_00.len_ = 2;
  text_00.str_ = "in";
  EvalString::AddSpecial(&command,text_00);
  text_01.len_ = 3;
  text_01.str_ = " > ";
  EvalString::AddText(&command,text_01);
  text_02.len_ = 3;
  text_02.str_ = "out";
  EvalString::AddSpecial(&command,text_02);
  this_00 = (Rule *)operator_new(0x50);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"cat",&local_159);
  Rule::Rule(this_00,&local_158);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"command",&local_159);
  Rule::AddBinding(this_00,&local_158,&command);
  std::__cxx11::string::~string((string *)&local_158);
  BindingEnv::AddRule(&state.bindings_,this_00);
  edge = State::AddEdge(&state,this_00);
  path_02.len_ = 3;
  path_02.str_ = "in1";
  State::AddIn(&state,edge,path_02,0);
  path_03.len_ = 3;
  path_03.str_ = "in2";
  State::AddIn(&state,edge,path_03,0);
  path_04.len_ = 3;
  path_04.str_ = "out";
  State::AddOut(&state,edge,path_04,0);
  pTVar1 = g_current_test;
  Edge::EvaluateCommand_abi_cxx11_(&local_158,edge,false);
  condition = std::operator==("cat in1 in2 > out",&local_158);
  testing::Test::Check
            (pTVar1,condition,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/state_test.cc"
             ,0x29,"\"cat in1 in2 > out\" == edge->EvaluateCommand()");
  std::__cxx11::string::~string((string *)&local_158);
  pTVar1 = g_current_test;
  path.len_ = 3;
  path.str_ = "in1";
  pNVar2 = State::GetNode(&state,path,0);
  testing::Test::Check
            (pTVar1,(bool)(pNVar2->dirty_ ^ 1),
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/state_test.cc"
             ,0x2b,"state.GetNode(\"in1\", 0)->dirty()");
  pTVar1 = g_current_test;
  path_00.len_ = 3;
  path_00.str_ = "in2";
  pNVar2 = State::GetNode(&state,path_00,0);
  testing::Test::Check
            (pTVar1,(bool)(pNVar2->dirty_ ^ 1),
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/state_test.cc"
             ,0x2c,"state.GetNode(\"in2\", 0)->dirty()");
  pTVar1 = g_current_test;
  path_01.len_ = 3;
  path_01.str_ = "out";
  pNVar2 = State::GetNode(&state,path_01,0);
  testing::Test::Check
            (pTVar1,(bool)(pNVar2->dirty_ ^ 1),
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/state_test.cc"
             ,0x2d,"state.GetNode(\"out\", 0)->dirty()");
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString::TokenType>_>_>
  ::~vector(&command.parsed_);
  State::~State(&state);
  return;
}

Assistant:

TEST(State, Basic) {
  State state;

  EvalString command;
  command.AddText("cat ");
  command.AddSpecial("in");
  command.AddText(" > ");
  command.AddSpecial("out");

  Rule* rule = new Rule("cat");
  rule->AddBinding("command", command);
  state.bindings_.AddRule(rule);

  Edge* edge = state.AddEdge(rule);
  state.AddIn(edge, "in1", 0);
  state.AddIn(edge, "in2", 0);
  state.AddOut(edge, "out", 0);

  EXPECT_EQ("cat in1 in2 > out", edge->EvaluateCommand());

  EXPECT_FALSE(state.GetNode("in1", 0)->dirty());
  EXPECT_FALSE(state.GetNode("in2", 0)->dirty());
  EXPECT_FALSE(state.GetNode("out", 0)->dirty());
}